

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3VarintLen(sqlite3_uint64 v)

{
  int i;
  sqlite3_uint64 v_local;
  
  i = 0;
  v_local = v;
  do {
    i = i + 1;
    v_local = v_local >> 7;
  } while (v_local != 0);
  return i;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3VarintLen(sqlite3_uint64 v){
  int i = 0;
  do{
    i++;
    v >>= 7;
  }while( v!=0 );
  return i;
}